

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr xmlXPtrNewRangePointNode(xmlXPathObjectPtr start,xmlNodePtr end)

{
  xmlXPathObjectPtr ret;
  xmlNodePtr end_local;
  xmlXPathObjectPtr start_local;
  
  if (start == (xmlXPathObjectPtr)0x0) {
    start_local = (xmlXPathObjectPtr)0x0;
  }
  else if (end == (xmlNodePtr)0x0) {
    start_local = (xmlXPathObjectPtr)0x0;
  }
  else if (start->type == XPATH_POINT) {
    start_local = xmlXPtrNewRangeInternal((xmlNodePtr)start->user,start->index,end,-1);
    xmlXPtrRangeCheckOrder(start_local);
  }
  else {
    start_local = (xmlXPathObjectPtr)0x0;
  }
  return start_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewRangePointNode(xmlXPathObjectPtr start, xmlNodePtr end) {
    xmlXPathObjectPtr ret;

    if (start == NULL)
	return(NULL);
    if (end == NULL)
	return(NULL);
    if (start->type != XPATH_POINT)
	return(NULL);

    ret = xmlXPtrNewRangeInternal(start->user, start->index, end, -1);
    xmlXPtrRangeCheckOrder(ret);
    return(ret);
}